

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_protocol_check_outgoing_commands(ENetHost *host,ENetPeer *peer)

{
  uint16_t uVar1;
  uint16_t uVar2;
  ushort uVar3;
  _ENetListNode *p_Var4;
  ENetChannel *pEVar5;
  bool bVar6;
  bool bVar7;
  void *data;
  uint local_84;
  ENetChannel *local_70;
  uint16_t unreliableSequenceNumber;
  uint16_t reliableSequenceNumber;
  uint32_t windowSize;
  int canPing;
  int windowWrap;
  int windowExceeded;
  size_t commandSize;
  ENetChannel *pEStack_40;
  uint16_t reliableWindow;
  ENetChannel *channel;
  ENetListIterator currentCommand;
  ENetOutgoingCommand *outgoingCommand;
  ENetBuffer *buffer;
  ENetProtocol *command;
  ENetPeer *peer_local;
  ENetHost *host_local;
  
  buffer = (ENetBuffer *)(host->commands + host->commandCount);
  outgoingCommand = (ENetOutgoingCommand *)(host->buffers + host->bufferCount);
  pEStack_40 = (ENetChannel *)0x0;
  commandSize._6_2_ = 0;
  bVar7 = false;
  bVar6 = false;
  _unreliableSequenceNumber = 1;
  channel = (ENetChannel *)(peer->outgoingCommands).sentinel.next;
LAB_00108c0a:
  do {
    if (channel == (ENetChannel *)&peer->outgoingCommands) {
LAB_00109225:
      host->commandCount = ((long)buffer - (long)host->commands) / 0x30;
      host->bufferCount = (long)outgoingCommand - (long)host->buffers >> 4;
      if ((((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
           ((peer->outgoingCommands).sentinel.next == &(peer->outgoingCommands).sentinel)) &&
          ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel)) &&
         ((peer->sentUnreliableCommands).sentinel.next == &(peer->sentUnreliableCommands).sentinel))
      {
        enet_peer_disconnect(peer,peer->eventData);
      }
      return _unreliableSequenceNumber;
    }
    currentCommand = (ENetListIterator)channel;
    if ((channel->incomingUnreliableSequenceNumber & 0x80) == 0) {
LAB_00108de7:
      p_Var4 = (_ENetListNode *)
               commandSizes[(int)((byte)channel->incomingUnreliableSequenceNumber & 0xf)];
      if (((&host->field_0x68c <= buffer) ||
          (&host->bufferCount <= &outgoingCommand->reliableSequenceNumber)) ||
         (((_ENetListNode *)((ulong)peer->mtu - host->packetSize) < p_Var4 ||
          ((*(long *)(channel[1].reliableWindows + 1) != 0 &&
           ((ushort)((short)peer->mtu - (short)host->packetSize) <
            (ushort)((short)p_Var4 + channel->reliableWindows[0xf]))))))) {
        host->continueSending = 1;
        goto LAB_00109225;
      }
      pEVar5 = *(ENetChannel **)channel;
      if ((channel->incomingUnreliableSequenceNumber & 0x80) == 0) {
        if (((*(long *)(channel[1].reliableWindows + 1) != 0) &&
            (*(int *)(channel->reliableWindows + 0xd) == 0)) &&
           ((**(uint **)(channel[1].reliableWindows + 1) & 0x20) == 0)) {
          peer->packetThrottleCounter = peer->packetThrottleCounter + 7;
          peer->packetThrottleCounter = peer->packetThrottleCounter & 0x1f;
          if (peer->packetThrottle < peer->packetThrottleCounter) {
            uVar1 = channel->reliableWindows[5];
            uVar2 = channel->reliableWindows[6];
            channel = pEVar5;
            while( true ) {
              *(int *)&currentCommand[5].previous[1].previous =
                   *(int *)&currentCommand[5].previous[1].previous + -1;
              if (*(int *)&currentCommand[5].previous[1].previous == 0) {
                enet_packet_destroy((ENetPacket *)currentCommand[5].previous);
              }
              enet_list_remove(currentCommand);
              enet_free(currentCommand);
              if (((channel == (ENetChannel *)&peer->outgoingCommands) ||
                  (currentCommand = (ENetListIterator)channel, channel->reliableWindows[5] != uVar1)
                  ) || (channel->reliableWindows[6] != uVar2)) break;
              channel = *(ENetChannel **)channel;
            }
            goto LAB_00108c0a;
          }
        }
        enet_list_remove((ENetListIterator)channel);
        if (*(long *)(channel[1].reliableWindows + 1) != 0) {
          enet_list_insert(&(peer->sentUnreliableCommands).sentinel,channel);
        }
      }
      else {
        if ((pEStack_40 != (ENetChannel *)0x0) && (channel->incomingReliableSequenceNumber == 0)) {
          pEStack_40->usedReliableWindows =
               pEStack_40->usedReliableWindows | (ushort)(1 << (sbyte)commandSize._6_2_);
          pEStack_40->reliableWindows[commandSize._6_2_] =
               pEStack_40->reliableWindows[commandSize._6_2_] + 1;
        }
        channel->incomingReliableSequenceNumber = channel->incomingReliableSequenceNumber + 1;
        if (*(int *)(channel->reliableWindows + 9) == 0) {
          *(uint32_t *)(channel->reliableWindows + 9) =
               peer->roundTripTime + peer->roundTripTimeVariance * 4;
          *(uint32_t *)(channel->reliableWindows + 0xb) =
               peer->timeoutLimit * *(int *)(channel->reliableWindows + 9);
        }
        if ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel) {
          peer->nextTimeout = host->serviceTime + *(int *)(channel->reliableWindows + 9);
        }
        data = enet_list_remove((ENetListIterator)channel);
        enet_list_insert(&(peer->sentReliableCommands).sentinel,data);
        *(uint32_t *)(channel->reliableWindows + 7) = host->serviceTime;
        host->headerFlags = host->headerFlags | 0x4000;
        peer->reliableDataInTransit =
             (uint)channel->reliableWindows[0xf] + peer->reliableDataInTransit;
      }
      (outgoingCommand->outgoingCommandList).next = (_ENetListNode *)buffer;
      (outgoingCommand->outgoingCommandList).previous = p_Var4;
      host->packetSize =
           (long)&((outgoingCommand->outgoingCommandList).previous)->next + host->packetSize;
      memcpy(buffer,&channel->incomingUnreliableSequenceNumber,0x30);
      if (*(long *)(channel[1].reliableWindows + 1) == 0) {
        if ((channel->incomingUnreliableSequenceNumber & 0x80) == 0) {
          enet_free(channel);
        }
      }
      else {
        *(ulong *)&outgoingCommand->reliableSequenceNumber =
             *(long *)(*(long *)(channel[1].reliableWindows + 1) + 8) +
             (ulong)*(uint *)(channel->reliableWindows + 0xd);
        uVar3 = channel->reliableWindows[0xf];
        outgoingCommand->roundTripTimeout = (int)(ulong)uVar3;
        outgoingCommand->roundTripTimeoutLimit = (int)((ulong)uVar3 >> 0x20);
        host->packetSize = (ulong)channel->reliableWindows[0xf] + host->packetSize;
        outgoingCommand = (ENetOutgoingCommand *)&outgoingCommand->reliableSequenceNumber;
      }
      peer->totalPacketsSent = peer->totalPacketsSent + 1;
      buffer = buffer + 3;
      outgoingCommand = (ENetOutgoingCommand *)&outgoingCommand->reliableSequenceNumber;
      channel = pEVar5;
      goto LAB_00108c0a;
    }
    if ((ulong)*(byte *)((long)&channel->incomingUnreliableSequenceNumber + 1) < peer->channelCount)
    {
      local_70 = peer->channels + *(byte *)((long)&channel->incomingUnreliableSequenceNumber + 1);
    }
    else {
      local_70 = (ENetChannel *)0x0;
    }
    pEStack_40 = local_70;
    commandSize._6_2_ = channel->reliableWindows[5] / 0x1000;
    if (local_70 == (ENetChannel *)0x0) {
LAB_00108d4a:
      if (*(long *)(channel[1].reliableWindows + 1) != 0) {
        if (!bVar7) {
          local_84 = peer->packetThrottle * peer->windowSize >> 5;
          if (local_84 <= peer->mtu) {
            local_84 = peer->mtu;
          }
          if (local_84 < peer->reliableDataInTransit + (uint)channel->reliableWindows[0xf]) {
            bVar7 = true;
          }
        }
        if (bVar7) {
          channel = *(ENetChannel **)channel;
          goto LAB_00108c0a;
        }
      }
      _unreliableSequenceNumber = 0;
      goto LAB_00108de7;
    }
    if ((((!bVar6) && (channel->incomingReliableSequenceNumber == 0)) &&
        ((uint)channel->reliableWindows[5] % 0x1000 == 0)) &&
       ((0xfff < local_70->reliableWindows[(int)((commandSize._6_2_ + 0xf) % 0x10)] ||
        (((uint)local_70->usedReliableWindows &
         (0x3ff << (sbyte)commandSize._6_2_ | 0x3ff >> (0x10U - (sbyte)commandSize._6_2_ & 0x1f)))
         != 0)))) {
      bVar6 = true;
    }
    if (!bVar6) goto LAB_00108d4a;
    channel = *(ENetChannel **)channel;
  } while( true );
}

Assistant:

static int enet_protocol_check_outgoing_commands(ENetHost* host, ENetPeer* peer) {
	ENetProtocol* command = &host->commands[host->commandCount];
	ENetBuffer* buffer = &host->buffers[host->bufferCount];
	ENetOutgoingCommand* outgoingCommand;
	ENetListIterator currentCommand;
	ENetChannel* channel = NULL;
	uint16_t reliableWindow = 0;
	size_t commandSize = 0;
	int windowExceeded = 0, windowWrap = 0, canPing = 1;
	currentCommand = enet_list_begin(&peer->outgoingCommands);

	while (currentCommand != enet_list_end(&peer->outgoingCommands)) {
		outgoingCommand = (ENetOutgoingCommand*)currentCommand;

		if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
			channel = outgoingCommand->command.header.channelID < peer->channelCount ? &peer->channels[outgoingCommand->command.header.channelID] : NULL;
			reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

			if (channel != NULL) {
				if (!windowWrap && outgoingCommand->sendAttempts < 1 && !(outgoingCommand->reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) && (channel->reliableWindows[(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE || channel->usedReliableWindows & ((((1 << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) << reliableWindow) | (((1 << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow)))))
					windowWrap = 1;

				if (windowWrap) {
					currentCommand = enet_list_next(currentCommand);

					continue;
				}
			}

			if (outgoingCommand->packet != NULL) {
				if (!windowExceeded) {
					uint32_t windowSize = (peer->packetThrottle * peer->windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;

					if (peer->reliableDataInTransit + outgoingCommand->fragmentLength > ENET_MAX(windowSize, peer->mtu))
						windowExceeded = 1;
				}

				if (windowExceeded) {
					currentCommand = enet_list_next(currentCommand);

					continue;
				}
			}

			canPing = 0;
		}

		commandSize = commandSizes[outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK];

		if (command >= &host->commands[sizeof(host->commands) / sizeof(ENetProtocol)] || buffer + 1 >= &host->buffers[sizeof(host->buffers) / sizeof(ENetBuffer)] || peer->mtu - host->packetSize < commandSize || (outgoingCommand->packet != NULL && (uint16_t)(peer->mtu - host->packetSize) < (uint16_t)(commandSize + outgoingCommand->fragmentLength))) {
			host->continueSending = 1;

			break;
		}

		currentCommand = enet_list_next(currentCommand);

		if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
			if (channel != NULL && outgoingCommand->sendAttempts < 1) {
				channel->usedReliableWindows |= 1 << reliableWindow;
				++channel->reliableWindows[reliableWindow];
			}

			++outgoingCommand->sendAttempts;

			if (outgoingCommand->roundTripTimeout == 0) {
				outgoingCommand->roundTripTimeout = peer->roundTripTime + 4 * peer->roundTripTimeVariance;
				outgoingCommand->roundTripTimeoutLimit = peer->timeoutLimit * outgoingCommand->roundTripTimeout;
			}

			if (enet_list_empty(&peer->sentReliableCommands))
				peer->nextTimeout = host->serviceTime + outgoingCommand->roundTripTimeout;

			enet_list_insert(enet_list_end(&peer->sentReliableCommands),
				enet_list_remove(&outgoingCommand->outgoingCommandList));

			outgoingCommand->sentTime = host->serviceTime;
			host->headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;
			peer->reliableDataInTransit += outgoingCommand->fragmentLength;
		}
		else {
			if (outgoingCommand->packet != NULL && outgoingCommand->fragmentOffset == 0 && !(outgoingCommand->packet->flags & (ENET_PACKET_FLAG_UNTHROTTLED))) {
				peer->packetThrottleCounter += ENET_PEER_PACKET_THROTTLE_COUNTER;
				peer->packetThrottleCounter %= ENET_PEER_PACKET_THROTTLE_SCALE;

				if (peer->packetThrottleCounter > peer->packetThrottle) {
					uint16_t reliableSequenceNumber = outgoingCommand->reliableSequenceNumber,

						unreliableSequenceNumber = outgoingCommand->unreliableSequenceNumber;

					for (;;) {
						--outgoingCommand->packet->referenceCount;

						if (outgoingCommand->packet->referenceCount == 0)
							enet_packet_destroy(outgoingCommand->packet);

						enet_list_remove(&outgoingCommand->outgoingCommandList);
						enet_free(outgoingCommand);

						if (currentCommand == enet_list_end(&peer->outgoingCommands))
							break;

						outgoingCommand = (ENetOutgoingCommand*)currentCommand;

						if (outgoingCommand->reliableSequenceNumber != reliableSequenceNumber || outgoingCommand->unreliableSequenceNumber != unreliableSequenceNumber)
							break;

						currentCommand = enet_list_next(currentCommand);
					}

					continue;
				}
			}

			enet_list_remove(&outgoingCommand->outgoingCommandList);

			if (outgoingCommand->packet != NULL)
				enet_list_insert(enet_list_end(&peer->sentUnreliableCommands), outgoingCommand);
		}

		buffer->data = command;
		buffer->dataLength = commandSize;
		host->packetSize += buffer->dataLength;
		*command = outgoingCommand->command;

		if (outgoingCommand->packet != NULL) {
			++buffer;
			buffer->data = outgoingCommand->packet->data + outgoingCommand->fragmentOffset;
			buffer->dataLength = outgoingCommand->fragmentLength;
			host->packetSize += outgoingCommand->fragmentLength;
		}
		else if (!(outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)) {
			enet_free(outgoingCommand);
		}

		++peer->totalPacketsSent;
		++command;
		++buffer;
	}

	host->commandCount = command - host->commands;
	host->bufferCount = buffer - host->buffers;

	if (peer->state == ENET_PEER_STATE_DISCONNECT_LATER && enet_list_empty(&peer->outgoingCommands) && enet_list_empty(&peer->sentReliableCommands) && enet_list_empty(&peer->sentUnreliableCommands))
		enet_peer_disconnect(peer, peer->eventData);

	return canPing;
}